

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int ffdtyp(char *cval,char *dtype,int *status)

{
  char *pcVar1;
  char cVar2;
  
  if (0 < *status) {
    return *status;
  }
  cVar2 = *cval;
  if (cVar2 != 'T') {
    if (cVar2 == '\'') {
      cVar2 = 'C';
      goto LAB_001387d0;
    }
    if (cVar2 == '(') {
      cVar2 = 'X';
      goto LAB_001387d0;
    }
    if (cVar2 != 'F') {
      if (cVar2 == '\0') {
        *status = 0xcc;
        return 0xcc;
      }
      pcVar1 = strchr(cval,0x2e);
      cVar2 = 'F';
      if ((pcVar1 == (char *)0x0) && (pcVar1 = strchr(cval,0x45), pcVar1 == (char *)0x0)) {
        pcVar1 = strchr(cval,0x44);
        cVar2 = (pcVar1 == (char *)0x0) * '\x03' + 'F';
      }
      goto LAB_001387d0;
    }
  }
  cVar2 = 'L';
LAB_001387d0:
  *dtype = cVar2;
  return *status;
}

Assistant:

int ffdtyp(const char *cval,  /* I - formatted string representation of the value */
           char *dtype, /* O - datatype code: C, L, F, I, or X */
          int *status)  /* IO - error status */
/*
  determine implicit datatype of input string.
  This assumes that the string conforms to the FITS standard
  for keyword values, so may not detect all invalid formats.
*/
{

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (cval[0] == '\0')
        return(*status = VALUE_UNDEFINED);
    else if (cval[0] == '\'')
        *dtype = 'C';          /* character string starts with a quote */
    else if (cval[0] == 'T' || cval[0] == 'F')
        *dtype = 'L';          /* logical = T or F character */
    else if (cval[0] == '(')
        *dtype = 'X';          /* complex datatype "(1.2, -3.4)" */
    else if (strchr(cval,'.'))
        *dtype = 'F';          /* float usualy contains a decimal point */
    else if (strchr(cval,'E') || strchr(cval,'D') )
        *dtype = 'F';          /* exponential contains a E or D */
    else
        *dtype = 'I';          /* if none of the above assume it is integer */

    return(*status);
}